

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

double __thiscall ON_OutlineFigure::BoxArea(ON_OutlineFigure *this)

{
  bool bVar1;
  double local_60;
  double dy;
  double dx;
  double bbox_area;
  ON_BoundingBox bbox;
  ON_OutlineFigure *this_local;
  
  bbox.m_max.z = (double)this;
  BoundingBox((ON_BoundingBox *)&bbox_area,this);
  bVar1 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)&bbox_area);
  if (bVar1) {
    if ((bbox.m_min.z - bbox_area < 0.0) || (bbox.m_max.x - bbox.m_min.x < 0.0)) {
      local_60 = 0.0;
    }
    else {
      local_60 = (bbox.m_min.z - bbox_area) * (bbox.m_max.x - bbox.m_min.x);
    }
    dx = local_60;
  }
  else {
    dx = 0.0;
  }
  return dx;
}

Assistant:

double ON_OutlineFigure::BoxArea() const
{
  const ON_BoundingBox bbox = BoundingBox();
  double bbox_area = 0.0;
  if (bbox.IsNotEmpty())
  {
    const double dx = bbox.m_max.x - bbox.m_min.x;
    const double dy = bbox.m_max.y - bbox.m_min.y;
    bbox_area = (dx >= 0.0 && dy >= 0.0) ? (dx*dy) : 0.0;
  }
  else
  {
    bbox_area = 0.0;
  }
  return bbox_area;
}